

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_column_writer.cpp
# Opt level: O0

void __thiscall
duckdb::EnumColumnWriter::WriteEnumInternal<unsigned_int>
          (EnumColumnWriter *this,WriteStream *temp_writer,Vector *input_column,idx_t chunk_start,
          idx_t chunk_end,EnumWriterPageState *page_state)

{
  bool bVar1;
  RleBpEncoder *this_00;
  TemplatedValidityMask<unsigned_long> *in_RCX;
  WriteStream *in_RDI;
  TemplatedValidityMask<unsigned_long> *in_R8;
  long in_R9;
  idx_t r;
  uint *ptr;
  ValidityMask *mask;
  uchar in_stack_ffffffffffffffaf;
  
  FlatVector::Validity((Vector *)0x2406366);
  this_00 = (RleBpEncoder *)FlatVector::GetData<unsigned_int>((Vector *)0x2406375);
  for (; in_RCX < in_R8;
      in_RCX = (TemplatedValidityMask<unsigned_long> *)((long)&in_RCX->validity_mask + 1)) {
    bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid(in_RCX,(idx_t)in_RDI);
    if (bVar1) {
      if ((*(byte *)(in_R9 + 0x828) & 1) == 0) {
        WriteStream::Write<unsigned_char>(in_RDI,in_stack_ffffffffffffffaf);
        RleBpEncoder::BeginWrite((RleBpEncoder *)(in_R9 + 8));
        *(undefined1 *)(in_R9 + 0x828) = 1;
      }
      RleBpEncoder::WriteValue(this_00,(WriteStream *)in_RCX,(uint32_t *)in_RDI);
    }
  }
  return;
}

Assistant:

void EnumColumnWriter::WriteEnumInternal(WriteStream &temp_writer, Vector &input_column, idx_t chunk_start,
                                         idx_t chunk_end, EnumWriterPageState &page_state) {
	auto &mask = FlatVector::Validity(input_column);
	auto *ptr = FlatVector::GetData<T>(input_column);
	for (idx_t r = chunk_start; r < chunk_end; r++) {
		if (mask.RowIsValid(r)) {
			if (!page_state.written_value) {
				// first value: write the bit-width as a one-byte entry and initialize writer
				temp_writer.Write<uint8_t>(bit_width);
				page_state.encoder.BeginWrite();
				page_state.written_value = true;
			}
			page_state.encoder.WriteValue(temp_writer, ptr[r]);
		}
	}
}